

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_eval.hpp
# Opt level: O1

Boxed_Value __thiscall
chaiscript::eval::Switch_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>::
eval_internal(Switch_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_> *this
             ,Dispatch_State *t_ss)

{
  Type_Conversions *pTVar1;
  Dispatch_State *t_e;
  bool bVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  undefined8 uVar4;
  bool bVar5;
  int iVar6;
  size_t *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long lVar7;
  ulong uVar8;
  Boxed_Value BVar9;
  string_view t_name;
  array<chaiscript::Boxed_Value,_2UL> p;
  Boxed_Value match_value;
  undefined8 uStack_c0;
  pointer local_b8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_b0;
  undefined1 local_a8 [24];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  File_Position local_78;
  Type_Conversions_State local_70;
  undefined1 local_60 [32];
  undefined8 local_38;
  
  local_88._M_allocated_capacity = (size_type)this;
  chaiscript::detail::Dispatch_Engine::new_scope((Stack_Holder *)in_RDX[1]);
  AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>::eval
            ((AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_> *)
             (local_a8 + 0x10),
             (Dispatch_State *)
             ((t_ss[2].m_conversions.m_conversions._M_data)->m_mutex)._M_impl._M_rwlock.__align);
  local_78 = (File_Position)&t_ss[3].m_stack_holder;
  local_88._8_8_ = in_RDX + 2;
  bVar2 = false;
  for (uVar8 = 1; pTVar1 = t_ss[2].m_conversions.m_conversions._M_data,
      uVar8 < (ulong)((long)t_ss[2].m_conversions.m_saves._M_data - (long)pTVar1 >> 3);
      uVar8 = uVar8 + 1) {
    t_e = *(Dispatch_State **)((long)&(pTVar1->m_mutex)._M_impl._M_rwlock + uVar8 * 8);
    iVar6 = *(int *)&(t_e->m_stack_holder)._M_data;
    if (iVar6 == 0x25) {
      AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>::eval
                ((AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_> *)
                 (local_60 + 0x10),t_e);
      bVar2 = true;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._24_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._24_8_);
      }
    }
    else if (iVar6 == 0x24) {
      local_b8 = (pointer)local_a8._16_8_;
      local_b0 = local_90;
      if (local_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          local_90->_M_use_count = local_90->_M_use_count + 1;
          UNLOCK();
        }
        else {
          local_90->_M_use_count = local_90->_M_use_count + 1;
        }
      }
      AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>::eval
                ((AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_> *)
                 local_a8,(Dispatch_State *)
                          **(undefined8 **)
                            (*(long *)((long)&((t_ss[2].m_conversions.m_conversions._M_data)->
                                              m_mutex)._M_impl._M_rwlock + uVar8 * 8) + 0x50));
      bVar5 = true;
      if (!bVar2) {
        local_70.m_conversions._M_data = (Type_Conversions *)&local_b8;
        local_70.m_saves._M_data = (Conversion_Saves *)(local_a8 + 0x10);
        t_name._M_str = (char *)0x2;
        t_name._M_len = *in_RDX;
        chaiscript::detail::Dispatch_Engine::call_function
                  ((Dispatch_Engine *)local_60,t_name,(atomic_uint_fast32_t *)"==",
                   (Function_Params *)local_78,&local_70);
        bVar5 = boxed_cast<bool>((Boxed_Value *)local_60,(Type_Conversions_State *)0x0);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._8_8_);
        }
      }
      if (bVar5 != false) {
        AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>::eval
                  ((AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_> *
                   )&stack0xffffffffffffffc0,
                   *(Dispatch_State **)
                    ((long)&((t_ss[2].m_conversions.m_conversions._M_data)->m_mutex)._M_impl.
                            _M_rwlock + uVar8 * 8));
        bVar2 = true;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38 !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38);
        }
      }
      lVar7 = 0x20;
      do {
        if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&uStack_c0 + lVar7) !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&uStack_c0 + lVar7));
        }
        lVar7 = lVar7 + -0x10;
      } while (lVar7 != 0);
    }
  }
  if ((void_var()::v == '\0') && (iVar6 = __cxa_guard_acquire(&void_var()::v), iVar6 != 0)) {
    Boxed_Value::Boxed_Value<chaiscript::Boxed_Value::Void_Type,void>
              (&void_var::v,(Void_Type *)&local_b8,false);
    __cxa_atexit(Boxed_Value::~Boxed_Value,&void_var::v,&__dso_handle);
    __cxa_guard_release(&void_var()::v);
  }
  uVar4 = local_88._M_allocated_capacity;
  *(element_type **)local_88._M_allocated_capacity =
       void_var::v.m_data.
       super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  _Var3 = void_var::v.m_data.
          super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_88._M_allocated_capacity + 8) =
       void_var::v.m_data.
       super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
       _M_pi;
  if (_Var3._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (_Var3._M_pi)->_M_use_count = (_Var3._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (_Var3._M_pi)->_M_use_count = (_Var3._M_pi)->_M_use_count + 1;
    }
  }
  if (local_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_90);
  }
  chaiscript::detail::Dispatch_Engine::pop_scope((Stack_Holder *)in_RDX[1]);
  BVar9.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  BVar9.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)uVar4;
  return (Boxed_Value)
         BVar9.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Boxed_Value eval_internal(const chaiscript::detail::Dispatch_State &t_ss) const override {
        bool breaking = false;
        size_t currentCase = 1;
        bool hasMatched = false;

        chaiscript::eval::detail::Scope_Push_Pop spp(t_ss);

        Boxed_Value match_value(this->children[0]->eval(t_ss));

        while (!breaking && (currentCase < this->children.size())) {
          try {
            if (this->children[currentCase]->identifier == AST_Node_Type::Case) {
              // This is a little odd, but because want to see both the switch and the case simultaneously, I do a downcast here.
              try {
                std::array<Boxed_Value, 2> p{match_value, this->children[currentCase]->children[0]->eval(t_ss)};
                if (hasMatched || boxed_cast<bool>(t_ss->call_function("==", m_loc, Function_Params{p}, t_ss.conversions()))) {
                  this->children[currentCase]->eval(t_ss);
                  hasMatched = true;
                }
              } catch (const exception::bad_boxed_cast &) {
                throw exception::eval_error("Internal error: case guard evaluation not boolean");
              }
            } else if (this->children[currentCase]->identifier == AST_Node_Type::Default) {
              this->children[currentCase]->eval(t_ss);
              hasMatched = true;
            }
          } catch (detail::Break_Loop &) {
            breaking = true;
          }
          ++currentCase;
        }
        return void_var();
      }